

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
* google::protobuf::compiler::cpp::TopologicalSortMessagesInFile
            (vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
             *__return_storage_ptr__,FileDescriptor *file,MessageSCCAnalyzer *scc_analyzer)

{
  SCC **ppSVar1;
  iterator __position;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  SCC *pSVar10;
  pointer ppDVar11;
  reference ppVar12;
  reference ppVar13;
  ulong uVar14;
  pointer prVar15;
  reference ppSVar16;
  pointer prVar17;
  Descriptor **key;
  SCC **child;
  SCC **k;
  slot_type *psVar18;
  __normal_iterator<const_google::protobuf::compiler::SCC_**,_std::vector<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>_>
  __i;
  pointer ppDVar19;
  anon_union_8_1_a8a14541_for_iterator_2 aVar20;
  pointer ppDVar21;
  iterator iVar22;
  Descriptor *d;
  iterator __begin3_1;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *sorted_messages;
  SCC *scc;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  messages_in_file;
  SCC *parent;
  queue<const_google::protobuf::compiler::SCC_*,_std::deque<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>_>
  sccs_to_process;
  flat_hash_map<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::flat_hash_set<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_absl::lts_20240722::flat_hash_set<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>_>_>_>
  child_to_parent_scc_map;
  flat_hash_map<const_google::protobuf::compiler::SCC_*,_int,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>
  scc_to_outgoing_edges_map;
  SCC *scc_1;
  iterator it;
  flat_hash_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::compiler::SCC_*>_>_>
  descriptor_to_scc_map;
  undefined1 local_1a8 [16];
  slot_type *local_198;
  iterator local_188;
  slot_type *local_178;
  vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
  *local_170;
  iterator local_168;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_158;
  SCC *local_138;
  slot_type *local_130;
  iterator local_128;
  _Deque_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
  local_118;
  undefined1 local_c8 [32];
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>
  local_a8;
  iterator local_88;
  key_arg<const_google::protobuf::compiler::SCC_*> local_78;
  iterator local_70;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::compiler::SCC_*>_>_>
  local_60;
  LogMessageFatal local_40 [16];
  
  local_158.
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170 = (vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
               *)__return_storage_ptr__;
  FlattenMessagesInFile(file,&local_158);
  if (local_158.
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_158.
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    *(undefined8 *)local_170 = 0;
    *(pointer *)(local_170 + 8) = (pointer)0x0;
    *(pointer *)(local_170 + 0x10) = (pointer)0x0;
  }
  else {
    local_60.settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::compiler::SCC_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 1;
    local_60.settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::compiler::SCC_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::compiler::SCC_*>_>_>
    ::reserve(&local_60,
              (long)local_158.
                    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_158.
                    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    ppDVar19 = local_158.
               super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    ppDVar11 = local_158.
               super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (local_158.
        super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_158.
        super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppDVar21 = local_158.
                 super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_1a8._0_8_ = *ppDVar21;
        pSVar10 = SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::
                  GetSCC(&scc_analyzer->analyzer_,*ppDVar21);
        local_188.ctrl_ = (ctrl_t *)pSVar10;
        local_c8._8_8_ = &local_188;
        local_c8._0_8_ = local_1a8;
        local_a8.settings_.
        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
        capacity_ = (size_t)&local_60;
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::compiler::SCC_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::compiler::SCC_const*>>>
        ::EmplaceDecomposable::operator()
                  ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::compiler::SCC_*>_>_>::iterator,_bool>
                    *)&local_118,&local_a8,(Descriptor **)local_1a8,
                   (piecewise_construct_t *)&std::piecewise_construct,
                   (tuple<const_google::protobuf::Descriptor_*&> *)local_c8,
                   (tuple<const_google::protobuf::compiler::SCC_*&&> *)(local_c8 + 8));
        ppDVar21 = ppDVar21 + 1;
        ppDVar11 = local_158.
                   super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      } while (ppDVar21 != ppDVar19);
    }
    if ((long)ppDVar11 -
        (long)local_158.
              super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 !=
        local_60.settings_.
        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::compiler::SCC_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_
        >> 1) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_118,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/cpp/helpers.cc"
                 ,0x588,0x37,"messages_in_file.size() == descriptor_to_scc_map.size()");
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (&local_118,0x28,"messages_in_file has duplicate messages!");
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_118);
    }
    local_c8._0_8_ = (Descriptor **)0x0;
    local_c8._8_8_ = (iterator *)0x0;
    local_c8._16_8_ = google::protobuf::internal::TypeCardToString_abi_cxx11_;
    local_a8.settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 1;
    local_a8.settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    local_118._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_118._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_118._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_118._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_118._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_118._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_118._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_118._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_118._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::
    _Deque_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
    ::_M_initialize_map(&local_118,0);
    local_1a8 = (undefined1  [16])
                absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::compiler::SCC_*>_>_>
                ::begin(&local_60);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_188.field_1;
    local_188 = (iterator)(auVar3 << 0x40);
    while (bVar9 = absl::lts_20240722::container_internal::operator==
                             ((iterator *)local_1a8,(iterator *)&local_188), !bVar9) {
      ppVar12 = absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::compiler::SCC_*>_>_>
                ::iterator::operator*((iterator *)local_1a8);
      if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_118._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>
        ::_M_push_back_aux<google::protobuf::compiler::SCC_const*const&>
                  ((deque<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>
                    *)&local_118,&ppVar12->second);
      }
      else {
        *local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar12->second;
        local_118._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_118._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::compiler::SCC_*>_>_>
      ::iterator::operator++((iterator *)local_1a8);
    }
    if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_118._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        local_168.ctrl_ = (ctrl_t *)*local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (local_118._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_118._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_118._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_118._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_118._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_118._M_impl.super__Deque_impl_data._M_start._M_last =
               local_118._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
          local_118._M_impl.super__Deque_impl_data._M_start._M_first =
               local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_118._M_impl.super__Deque_impl_data._M_start._M_node =
               local_118._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_118._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_118._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        absl::lts_20240722::container_internal::
        raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,int>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,int>>>
        ::try_emplace_impl<google::protobuf::compiler::SCC_const*const&>
                  ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>::iterator,_bool>
                    *)local_1a8,&local_a8,(SCC **)&local_168);
        k = *(SCC ***)(local_168.ctrl_ + 0x18);
        ppSVar1 = *(SCC ***)(local_168.ctrl_ + 0x20);
        if (k != ppSVar1) {
          uVar7 = local_1a8._8_8_;
          do {
            absl::lts_20240722::container_internal::
            raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,absl::lts_20240722::flat_hash_set<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<google::protobuf::compiler::SCC_const*>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,absl::lts_20240722::flat_hash_set<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<google::protobuf::compiler::SCC_const*>>>>>
            ::try_emplace_impl<google::protobuf::compiler::SCC_const*const&>
                      ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::flat_hash_set<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_absl::lts_20240722::flat_hash_set<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>_>_>_>::iterator,_bool>
                        *)local_1a8,local_c8,k);
            uVar8 = local_1a8._8_8_;
            if ((((slot_type *)(local_1a8._8_8_ + 0x10))->value).first < (Descriptor *)0x2) {
              if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_118._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::
                deque<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>
                ::_M_push_back_aux<google::protobuf::compiler::SCC_const*const&>
                          ((deque<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>
                            *)&local_118,k);
              }
              else {
                *local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = *k;
                local_118._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_118._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
            }
            local_188.ctrl_ = (ctrl_t *)(uVar8 + 8);
            absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::compiler::SCC_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<google::protobuf::compiler::SCC_const*>>
            ::EmplaceDecomposable::operator()
                      ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>::iterator,_bool>
                        *)local_1a8,&local_188,(SCC **)&local_168,(SCC **)&local_168);
            if (local_198._0_1_ == true) {
              *(int *)(uVar7 + 8) = *(int *)(uVar7 + 8) + 1;
            }
            k = k + 1;
          } while (k != ppSVar1);
        }
      } while (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_118._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    local_1a8 = ZEXT816(0);
    local_198 = (slot_type *)0x0;
    local_188 = (iterator)
                absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>
                ::begin(&local_a8);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_168.field_1;
    local_168 = (iterator)(auVar4 << 0x40);
    while (bVar9 = absl::lts_20240722::container_internal::operator==
                             ((iterator *)&local_188,(iterator *)&local_168), !bVar9) {
      ppVar13 = absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>
                ::iterator::operator*((iterator *)&local_188);
      if (ppVar13->second == 0) {
        if ((slot_type *)local_1a8._8_8_ == local_198) {
          std::
          vector<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>
          ::_M_realloc_insert<google::protobuf::compiler::SCC_const*const&>
                    ((vector<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>
                      *)local_1a8,(iterator)local_1a8._8_8_,(SCC **)ppVar13);
        }
        else {
          *(SCC **)local_1a8._8_8_ = (SCC *)ppVar13->first;
          local_1a8._8_8_ = (slot_type *)(local_1a8._8_8_ + 8);
        }
      }
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>
      ::iterator::operator++((iterator *)&local_188);
    }
    if (local_1a8._0_8_ == local_1a8._8_8_) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/cpp/helpers.cc"
                 ,0x5b2,0x13,"!next_scc_q.empty()");
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                (&local_188,0x1a,"No independent components!");
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_188);
    }
    *(undefined8 *)local_170 = 0;
    *(pointer *)(local_170 + 8) = (pointer)0x0;
    *(pointer *)(local_170 + 0x10) = (pointer)0x0;
    aVar20 = (anon_union_8_1_a8a14541_for_iterator_2)local_1a8._8_8_;
    psVar18 = (slot_type *)local_1a8._0_8_;
    do {
      local_130 = local_198;
      uVar14 = (long)aVar20.slot_ - (long)psVar18 >> 3;
      lVar2 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      local_1a8 = ZEXT816(0);
      local_198 = (slot_type *)0x0;
      local_178 = psVar18;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::compiler::SCC_const**,std::vector<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::TopologicalSortMessagesInFile(google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::MessageSCCAnalyzer&)::__0>>
                (psVar18,aVar20.slot_,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)aVar20.slot_ - (long)psVar18 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::SCC_const**,std::vector<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::TopologicalSortMessagesInFile(google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::MessageSCCAnalyzer&)::__0>>
                  (local_178,aVar20.slot_);
      }
      else {
        psVar18 = (slot_type *)((long)local_178 + 0x80);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::SCC_const**,std::vector<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::TopologicalSortMessagesInFile(google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::MessageSCCAnalyzer&)::__0>>
                  (local_178,psVar18);
        for (; psVar18 != aVar20.slot_; psVar18 = (slot_type *)&(psVar18->value).second) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::compiler::SCC_const**,std::vector<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::compiler::cpp::TopologicalSortMessagesInFile(google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::MessageSCCAnalyzer&)::__0>>
                    (psVar18);
        }
      }
      if (local_178 != aVar20.slot_) {
        do {
          local_78 = *(key_arg<const_google::protobuf::compiler::SCC_*> *)((long)aVar20.slot_ + -8);
          ppDVar11 = (local_78->descriptors).
                     super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          for (ppDVar19 = (local_78->descriptors).
                          super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppDVar19 != ppDVar11;
              ppDVar19 = ppDVar19 + 1) {
            local_188.ctrl_ = (ctrl_t *)*ppDVar19;
            iVar22 = absl::lts_20240722::container_internal::
                     raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::compiler::SCC_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::compiler::SCC_const*>>>
                     ::find<google::protobuf::Descriptor_const*>
                               ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::compiler::SCC_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::compiler::SCC_const*>>>
                                 *)&local_60,
                                (key_arg<const_google::protobuf::Descriptor_*> *)&local_188);
            if (iVar22.ctrl_ != (ctrl_t *)0x0) {
              __position._M_current = *(Descriptor ***)(local_170 + 8);
              if (__position._M_current == *(Descriptor ***)(local_170 + 0x10)) {
                std::
                vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
                          (local_170,__position,(Descriptor **)&local_188);
              }
              else {
                *__position._M_current = (Descriptor *)local_188.ctrl_;
                *(long *)(local_170 + 8) = *(long *)(local_170 + 8) + 8;
              }
            }
          }
          local_188 = absl::lts_20240722::container_internal::
                      raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,absl::lts_20240722::flat_hash_set<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<google::protobuf::compiler::SCC_const*>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,absl::lts_20240722::flat_hash_set<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<google::protobuf::compiler::SCC_const*>>>>>
                      ::find<google::protobuf::compiler::SCC_const*>
                                ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,absl::lts_20240722::flat_hash_set<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<google::protobuf::compiler::SCC_const*>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,absl::lts_20240722::flat_hash_set<google::protobuf::compiler::SCC_const*,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<google::protobuf::compiler::SCC_const*>>>>>
                                  *)local_c8,&local_78);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_168.field_1;
          local_168 = (iterator)(auVar5 << 0x40);
          bVar9 = absl::lts_20240722::container_internal::operator==(&local_188,&local_168);
          if (!bVar9) {
            prVar15 = absl::lts_20240722::container_internal::
                      raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::flat_hash_set<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_absl::lts_20240722::flat_hash_set<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>_>_>_>
                      ::iterator::operator->(&local_188);
            local_168 = (iterator)
                        absl::lts_20240722::container_internal::
                        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
                        ::begin(&(prVar15->second).
                                 super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
                               );
            local_128.ctrl_ = (ctrl_t *)0x0;
            while (bVar9 = absl::lts_20240722::container_internal::operator==
                                     ((iterator *)&local_168,&local_128), !bVar9) {
              ppSVar16 = absl::lts_20240722::container_internal::
                         raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
                         ::iterator::operator*((iterator *)&local_168);
              local_138 = *ppSVar16;
              local_70 = absl::lts_20240722::container_internal::
                         raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,int>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,int>>>
                         ::find<google::protobuf::compiler::SCC_const*>
                                   ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,int>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,int>>>
                                     *)&local_a8,&local_138);
              local_88.ctrl_ = (ctrl_t *)0x0;
              bVar9 = absl::lts_20240722::container_internal::operator==(&local_70,&local_88);
              if (bVar9) {
                absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                          (local_40,
                           "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/cpp/helpers.cc"
                           ,0x5d7,0x25,"it != scc_to_outgoing_edges_map.end()");
                absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
              }
              prVar17 = absl::lts_20240722::container_internal::
                        raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>
                        ::iterator::operator->(&local_70);
              if (prVar17->second < 1) {
                absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&local_88,
                           "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/cpp/helpers.cc"
                           ,0x5d8,0xe,"it->second > 0");
                absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                          ((LogMessageFatal *)&local_88);
              }
              prVar17 = absl::lts_20240722::container_internal::
                        raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>
                        ::iterator::operator->(&local_70);
              prVar17->second = prVar17->second + -1;
              prVar17 = absl::lts_20240722::container_internal::
                        raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>
                        ::iterator::operator->(&local_70);
              if (prVar17->second == 0) {
                if ((slot_type *)local_1a8._8_8_ == local_198) {
                  std::
                  vector<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>
                  ::_M_realloc_insert<google::protobuf::compiler::SCC_const*const&>
                            ((vector<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>
                              *)local_1a8,(iterator)local_1a8._8_8_,&local_138);
                }
                else {
                  *(SCC **)local_1a8._8_8_ = local_138;
                  local_1a8._8_8_ = (slot_type *)(local_1a8._8_8_ + 8);
                }
              }
              absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
              ::iterator::operator++((iterator *)&local_168);
            }
          }
          aVar20.slot_ = (slot_type *)((long)aVar20.slot_ + -8);
        } while (local_178 != aVar20.slot_);
      }
      if (local_178 != (slot_type *)0x0) {
        operator_delete(local_178,(long)local_130 - (long)local_178);
      }
      aVar20 = (anon_union_8_1_a8a14541_for_iterator_2)local_1a8._8_8_;
      psVar18 = (slot_type *)local_1a8._0_8_;
    } while (local_1a8._0_8_ != local_1a8._8_8_);
    local_188 = (iterator)
                absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>
                ::begin(&local_a8);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_168.field_1;
    local_168 = (iterator)(auVar6 << 0x40);
    while (bVar9 = absl::lts_20240722::container_internal::operator==
                             ((iterator *)&local_188,(iterator *)&local_168), !bVar9) {
      ppVar13 = absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>
                ::iterator::operator*((iterator *)&local_188);
      if (ppVar13->second != 0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_128,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/compiler/cpp/helpers.cc"
                   ,0x5e3,0xd,"p.second == 0");
        absl::lts_20240722::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                  (&local_128,0x10,"SCC left behind!");
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_128);
      }
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>
      ::iterator::operator++((iterator *)&local_188);
    }
    if ((Descriptor *)local_1a8._0_8_ != (Descriptor *)0x0) {
      operator_delete((void *)local_1a8._0_8_,(long)local_198 - local_1a8._0_8_);
    }
    std::
    _Deque_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
    ::~_Deque_base(&local_118);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_int>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_int>_>_>
    ::~raw_hash_set(&local_a8);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::flat_hash_set<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_absl::lts_20240722::flat_hash_set<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::flat_hash_set<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_absl::lts_20240722::flat_hash_set<const_google::protobuf::compiler::SCC_*,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>_>_>_>
                     *)local_c8);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::compiler::SCC_*>_>_>
    ::~raw_hash_set(&local_60);
  }
  if (local_158.
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
          *)local_170;
}

Assistant:

std::vector<const Descriptor*> TopologicalSortMessagesInFile(
    const FileDescriptor* file, MessageSCCAnalyzer& scc_analyzer) {
  // Collect the messages defined in this file.
  std::vector<const Descriptor*> messages_in_file = FlattenMessagesInFile(file);
  if (messages_in_file.empty()) return {};
  // Populate the map from the descriptor to the SCC to which the descriptor
  // belongs.
  absl::flat_hash_map<const Descriptor*, const SCC*> descriptor_to_scc_map;
  descriptor_to_scc_map.reserve(messages_in_file.size());
  for (const Descriptor* d : messages_in_file) {
    descriptor_to_scc_map.emplace(d, scc_analyzer.GetSCC(d));
  }
  ABSL_DCHECK(messages_in_file.size() == descriptor_to_scc_map.size())
      << "messages_in_file has duplicate messages!";
  // Each parent SCC has information about the child SCCs i.e. SCCs for fields
  // that are contained in the protos that belong to the parent SCC.  Use this
  // information to construct the inverse map from child SCC to parent SCC.
  absl::flat_hash_map<const SCC*, absl::flat_hash_set<const SCC*>>
      child_to_parent_scc_map;
  // For recording the number of edges from each SCC to other SCCs in the
  // forward map.
  absl::flat_hash_map<const SCC*, int> scc_to_outgoing_edges_map;
  std::queue<const SCC*> sccs_to_process;
  for (const auto& p : descriptor_to_scc_map) {
    sccs_to_process.push(p.second);
  }
  // Run a BFS to fill the two data structures: child_to_parent_scc_map and
  // scc_to_outgoing_edges_map.
  while (!sccs_to_process.empty()) {
    const SCC* scc = sccs_to_process.front();
    sccs_to_process.pop();
    auto& count = scc_to_outgoing_edges_map[scc];
    for (const auto& child : scc->children) {
      // Test whether this child has been seen thus far.  We do not know if the
      // children SCC vector contains unique children SCC.
      auto& parent_set = child_to_parent_scc_map[child];
      if (parent_set.empty()) {
        // Just added.
        sccs_to_process.push(child);
      }
      auto ret = parent_set.insert(scc);
      if (ret.second) {
        ++count;
      }
    }
  }
  std::vector<const SCC*> next_scc_q;
  // Find out the SCCs that do not have an outgoing edge i.e. the protos in this
  // SCC do not depend on protos other than the ones in this SCC.
  for (const auto& p : scc_to_outgoing_edges_map) {
    if (p.second == 0) {
      next_scc_q.push_back(p.first);
    }
  }
  ABSL_DCHECK(!next_scc_q.empty()) << "No independent components!";
  // Topologically sort the SCCs.
  // If an SCC no longer has an outgoing edge i.e. all the SCCs it depends on
  // have been ordered, then this SCC is now a candidate for ordering.
  std::vector<const Descriptor*> sorted_messages;
  while (!next_scc_q.empty()) {
    std::vector<const SCC*> current_scc_q;
    current_scc_q.swap(next_scc_q);
    // SCCs present in the current_scc_q are topologically equivalent to each
    // other.  Therefore they can be added to the output in any order.  We sort
    // these SCCs by the full_name() of the first descriptor that belongs to the
    // SCC.  This works well since the descriptors in each SCC are sorted by
    // full_name() and also that a descriptor can be part of only one SCC.
    std::sort(current_scc_q.begin(), current_scc_q.end(),
              [](const SCC* a, const SCC* b) {
                ABSL_DCHECK(!a->descriptors.empty()) << "No descriptors!";
                ABSL_DCHECK(!b->descriptors.empty()) << "No descriptors!";
                const Descriptor* ad = a->descriptors[0];
                const Descriptor* bd = b->descriptors[0];
                return ad->full_name() < bd->full_name();
              });
    while (!current_scc_q.empty()) {
      const SCC* scc = current_scc_q.back();
      current_scc_q.pop_back();
      // Messages in an SCC are already sorted on full_name().  So we can emit
      // them right away.
      for (const Descriptor* d : scc->descriptors) {
        // Only push messages that are defined in the file.
        if (descriptor_to_scc_map.contains(d)) {
          sorted_messages.push_back(d);
        }
      }
      // Find all the SCCs that are dependent on the current SCC.
      const auto& parents = child_to_parent_scc_map.find(scc);
      if (parents == child_to_parent_scc_map.end()) continue;
      for (const SCC* parent : parents->second) {
        auto it = scc_to_outgoing_edges_map.find(parent);
        ABSL_CHECK(it != scc_to_outgoing_edges_map.end());
        ABSL_CHECK(it->second > 0);
        // Reduce the dependency count for the SCC.  In case the dependency
        // count reaches 0, add the SCC to the list of SCCs to be ordered next.
        it->second--;
        if (it->second == 0) {
          next_scc_q.push_back(parent);
        }
      }
    }
  }
  for (const auto& p : scc_to_outgoing_edges_map) {
    ABSL_DCHECK(p.second == 0) << "SCC left behind!";
  }
  return sorted_messages;
}